

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidLoop2(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetworkLayer *pNVar5;
  GreaterThanLayerParams *pGVar6;
  ActivationParams *this_00;
  NeuralNetwork *pNVar7;
  LoopLayerParams *this_01;
  NeuralNetwork *pNVar8;
  ostream *poVar9;
  Model m;
  Result res;
  NeuralNetwork nnBody;
  NeuralNetwork nnCondition;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"B");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&nnCondition);
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&nnCondition.layers_);
  pGVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_greaterthan(pNVar5);
  pGVar6->alpha_ = 1.0;
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"cond");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"cond");
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&nnBody);
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&nnBody.layers_);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(this_00);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  pNVar7 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"for_loop");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_loop(pNVar5);
  pNVar8 = CoreML::Specification::LoopLayerParams::mutable_bodynetwork(this_01);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar8,&nnBody);
  pNVar8 = CoreML::Specification::LoopLayerParams::mutable_conditionnetwork(this_01);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar8,&nnCondition);
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"copy");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  CoreML::Specification::NeuralNetworkLayer::mutable_copy(pNVar5);
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x11e0);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&nnBody);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&nnCondition);
  CoreML::Specification::Model::~Model(&m);
  return (uint)bVar1;
}

Assistant:

int testInvalidLoop2() {
    /*
     condition network present but no condition variable
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond");
    l1->add_input("A");
    l1->add_output("cond");
    
    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");
    
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);
    
    auto *l4 = nnMain->add_layers();
    l4->set_name("copy");
    l4->add_input("A");
    l4->add_output("B");
    (void) l4->mutable_copy();
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}